

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

string * __thiscall
helics::CoreBroker::generateQueryAnswer_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view request,bool force_ordering)

{
  helics *phVar1;
  value_t vVar2;
  ushort index;
  pointer ptVar3;
  pointer pBVar4;
  pointer pBVar5;
  _Map_pointer ppBVar6;
  long lVar7;
  json_value jVar8;
  pointer pcVar9;
  undefined8 uVar10;
  string_view request_00;
  size_t __n;
  Time TVar11;
  bool bVar12;
  int iVar13;
  BasicFedInfo *fed;
  const_iterator cVar14;
  string *psVar15;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar16;
  pointer pBVar17;
  reference pvVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  LogLevels level;
  JsonMapBuilder *pJVar21;
  size_type __rlen_13;
  uint uVar22;
  char *pcVar23;
  ulong val;
  code *pcVar24;
  _func_int **pp_Var25;
  data *this_00;
  CoreBroker *pCVar26;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  GlobalFederateId *dep;
  pointer val_00;
  size_type __rlen;
  format_args args;
  string_view name;
  string_view request_01;
  string_view fmt;
  json base_2;
  string interfaceQueryResult;
  json base_4;
  string res;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffffd48;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [40];
  basic_string_view<char,_std::char_traits<char>_> local_260;
  Time local_250;
  data local_248;
  Time local_238;
  json_value jStack_230;
  _Alloc_hider local_228;
  json_value jStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  json_value jStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  data local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  data local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [16];
  data local_198;
  undefined1 local_188 [32];
  data local_168;
  data local_158;
  pointer local_148;
  json_value jStack_140;
  pointer local_138;
  json_value jStack_130;
  pointer local_128;
  json_value jStack_120;
  _Map_pointer local_118;
  json_value jStack_110;
  _Elt_pointer local_108;
  json_value jStack_100;
  _Elt_pointer local_f8;
  json_value jStack_f0;
  _Elt_pointer local_e8;
  json_value jStack_e0;
  data local_d0;
  data local_c0;
  data local_b0;
  data local_a0;
  data local_90;
  data local_80;
  data local_70;
  data local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  data local_40;
  
  local_260._M_str = request._M_str;
  local_260._M_len = request._M_len;
  quickBrokerQueries_abi_cxx11_((string *)local_188,this,request);
  pcVar23 = local_260._M_str;
  __n = local_260._M_len;
  if (local_188._8_8_ != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((__pthread_internal_list *)local_188._0_8_ == (__pthread_internal_list *)(local_188 + 0x10))
    {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_188._17_7_,local_188[0x10]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_188._24_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_188._0_8_;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_188._17_7_,local_188[0x10]);
    }
    __return_storage_ptr__->_M_string_length = local_188._8_8_;
    local_188._8_8_ = 0;
    local_188[0x10] = '\0';
    local_188._0_8_ = (__pthread_internal_list *)(local_188 + 0x10);
    goto LAB_002f1005;
  }
  phVar1 = (helics *)(local_260._M_len - 4);
  switch(phVar1) {
  case (helics *)0x0:
switchD_002f0fa5_caseD_0:
    iVar13 = bcmp(pcVar23,"logs",__n);
    if (iVar13 == 0) {
      local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
      local_288._8_8_ = (object_t *)0x0;
      BrokerBase::addBaseInformation
                (&this->super_BrokerBase,(json *)local_288,
                 (bool)((this->super_BrokerBase).field_0x294 ^ 1));
      bufferToJson(&((this->super_BrokerBase).mLogManager.
                     super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    mLogBuffer,(json *)local_288);
      fileops::generateJsonString((string *)__return_storage_ptr__,(json *)local_288,true);
      goto LAB_002f203a;
    }
    switch(__n) {
    case 5:
      goto switchD_002f0fa5_caseD_1;
    case 7:
      goto switchD_002f1143_caseD_7;
    case 9:
      goto switchD_002f0fa5_caseD_5;
    case 10:
      goto switchD_002f0fa5_caseD_6;
    case 0xc:
      goto switchD_002f0fa5_caseD_8;
    case 0xd:
      goto switchD_002f0fa5_caseD_9;
    }
    break;
  case (helics *)0x1:
switchD_002f0fa5_caseD_1:
    iVar13 = bcmp(pcVar23,"cores",__n);
    if (iVar13 == 0) {
      generateStringVector_if<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__5,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__6>
                (__return_storage_ptr__,&this->mBrokers);
      goto LAB_002f1005;
    }
    if ((helics *)__n == (helics *)0xc) goto switchD_002f0fa5_caseD_8;
    if ((helics *)__n == (helics *)0xd) goto switchD_002f0fa5_caseD_9;
    break;
  case (helics *)0x2:
    iVar13 = bcmp(local_260._M_str,"counts",local_260._M_len);
    if (iVar13 == 0) {
      local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
      local_288._8_8_ = (object_t *)0x0;
      BrokerBase::addBaseInformation
                (&this->super_BrokerBase,(json *)local_288,
                 (bool)((this->super_BrokerBase).field_0x294 ^ 1));
      local_e8 = (_Elt_pointer)0x0;
      jStack_e0.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_e8,
                 (long)((int)((ulong)((long)(this->mBrokers).dataStorage.
                                            super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->mBrokers).dataStorage.
                                           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x45d1745d));
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"brokers");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = (value_t)local_e8;
      local_e8 = (_Elt_pointer)CONCAT71(local_e8._1_7_,vVar2);
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value.object = (object_t *)jStack_e0;
      jStack_e0 = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_e8);
      local_f8 = (_Elt_pointer)0x0;
      jStack_f0.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_f8,
                 (long)((int)((ulong)((long)(this->mFederates).dataStorage.
                                            super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->mFederates).dataStorage.
                                           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x49249249));
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"federates");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = (value_t)local_f8;
      local_f8 = (_Elt_pointer)CONCAT71(local_f8._1_7_,vVar2);
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value.object = (object_t *)jStack_f0;
      jStack_f0 = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_f8);
      pBVar17 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pBVar4 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      val = 0;
      if (pBVar17 != pBVar4) {
        do {
          uVar22 = (int)val + (pBVar17->nonCounting ^ 1);
          val = (ulong)uVar22;
          pBVar17 = pBVar17 + 1;
        } while (pBVar17 != pBVar4);
        val = (ulong)uVar22;
      }
      local_108 = (_Elt_pointer)0x0;
      jStack_100.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_108,val);
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"countable_federates");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = (value_t)local_108;
      local_108 = (_Elt_pointer)CONCAT71(local_108._1_7_,vVar2);
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value.object = (object_t *)jStack_100;
      jStack_100 = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_108);
      ppBVar6 = (this->handles).handles.
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      local_118 = (_Map_pointer)0x0;
      jStack_110.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_118,
                 (long)(int)((int)((ulong)((long)(this->handles).handles.
                                                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                                          (long)(this->handles).handles.
                                                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                                  3) * 0x286bca1b +
                            (int)((ulong)((long)(this->handles).handles.
                                                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                         (long)(this->handles).handles.
                                               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                               ._M_impl.super__Deque_impl_data._M_finish._M_first)
                                 >> 3) * 0x286bca1b +
                            ((int)((ulong)((long)ppBVar6 -
                                          (long)(this->handles).handles.
                                                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_node) >>
                                  3) + -1 + (uint)(ppBVar6 == (_Map_pointer)0x0)) * 3));
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"interfaces");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = (value_t)local_118;
      local_118 = (_Map_pointer)CONCAT71(local_118._1_7_,vVar2);
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value.object = (object_t *)jStack_110;
      jStack_110 = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_118);
      fileops::generateJsonString((string *)__return_storage_ptr__,(json *)local_288,true);
      goto LAB_002f203a;
    }
    switch(phVar1) {
    case (helics *)0x0:
      goto switchD_002f0fa5_caseD_0;
    case (helics *)0x1:
      goto switchD_002f0fa5_caseD_1;
    case (helics *)0x2:
      goto switchD_002f10a3_caseD_2;
    case (helics *)0x3:
      goto switchD_002f0fa5_caseD_3;
    case (helics *)0x5:
      goto switchD_002f0fa5_caseD_5;
    case (helics *)0x6:
      goto switchD_002f0fa5_caseD_6;
    case (helics *)0x8:
      goto switchD_002f0fa5_caseD_8;
    case (helics *)0x9:
      goto switchD_002f0fa5_caseD_9;
    }
    break;
  case (helics *)0x3:
switchD_002f0fa5_caseD_3:
    iVar13 = bcmp(pcVar23,"summary",__n);
    if (iVar13 == 0) {
      generateFederationSummary_abi_cxx11_(__return_storage_ptr__,this);
      goto LAB_002f1005;
    }
    switch(phVar1) {
    case (helics *)0x0:
      goto switchD_002f0fa5_caseD_0;
    case (helics *)0x1:
      goto switchD_002f0fa5_caseD_1;
    case (helics *)0x2:
switchD_002f10a3_caseD_2:
      iVar13 = bcmp(pcVar23,"config",__n);
      if (iVar13 == 0) {
        local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
        local_2a8._8_8_ = (CoreBroker *)0x0;
        psVar15 = &(this->super_BrokerBase).identifier;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,psVar15);
        pvVar18 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_2a8,"name");
        vVar2 = (pvVar18->m_data).m_type;
        (pvVar18->m_data).m_type = local_40.m_type;
        jVar8 = (pvVar18->m_data).m_value;
        (pvVar18->m_data).m_value = local_40.m_value;
        local_40.m_type = vVar2;
        local_40.m_value = jVar8;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_40);
        if ((this->super_BrokerBase).uuid_like == true) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_50,psVar15);
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_2a8,"uuid");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_50._M_local_buf[0];
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value = (json_value)local_50._8_8_;
          local_50._M_local_buf[0] = vVar2;
          local_50._8_8_ = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_50);
        }
        if ((this->super_BrokerBase).field_0x294 == '\0') {
          local_128 = (pointer)0x0;
          jStack_120.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_128,(long)(this->super_BrokerBase).higher_broker_id.gid);
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_2a8,"parent");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = (value_t)local_128;
          local_128 = (pointer)CONCAT71(local_128._1_7_,vVar2);
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value.object = (object_t *)jStack_120;
          jStack_120 = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_128);
        }
        local_138 = (pointer)0x0;
        jStack_130.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_138,(long)(this->super_BrokerBase).global_broker_id_local.gid);
        pvVar18 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_2a8,anon_var_dwarf_70a93 + 0x27);
        vVar2 = (pvVar18->m_data).m_type;
        (pvVar18->m_data).m_type = (value_t)local_138;
        local_138 = (pointer)CONCAT71(local_138._1_7_,vVar2);
        jVar8 = (pvVar18->m_data).m_value;
        (pvVar18->m_data).m_value.object = (object_t *)jStack_130;
        jStack_130 = jVar8;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_138);
        logLevelToString_abi_cxx11_
                  ((string *)local_288,
                   (helics *)
                   (ulong)(uint)(this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i,
                   level);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
        pvVar18 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_2a8,"log_level");
        vVar2 = (pvVar18->m_data).m_type;
        (pvVar18->m_data).m_type = local_60.m_type;
        jVar8 = (pvVar18->m_data).m_value;
        (pvVar18->m_data).m_value = local_60.m_value;
        local_60.m_type = vVar2;
        local_60.m_value = jVar8;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_60);
        if ((CoreBroker *)local_288._0_8_ != (CoreBroker *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
        }
        local_148 = (pointer)0x0;
        jStack_140.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_148,(boolean_t)((this->super_BrokerBase).field_0x293 & 1));
        pvVar18 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_2a8,"root");
        vVar2 = (pvVar18->m_data).m_type;
        (pvVar18->m_data).m_type = (value_t)local_148;
        local_148 = (pointer)CONCAT71(local_148._1_7_,vVar2);
        jVar8 = (pvVar18->m_data).m_value;
        (pvVar18->m_data).m_value.object = (object_t *)jStack_140;
        jStack_140 = jVar8;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_148);
        fileops::generateJsonString((string *)__return_storage_ptr__,(json *)local_2a8,true);
        this_00 = (data *)local_2a8;
        goto LAB_002f203f;
      }
      switch(phVar1) {
      case (helics *)0x0:
        goto switchD_002f0fa5_caseD_0;
      case (helics *)0x1:
        goto switchD_002f0fa5_caseD_1;
      case (helics *)0x3:
        goto switchD_002f10a3_caseD_3;
      case (helics *)0x5:
        goto switchD_002f0fa5_caseD_5;
      case (helics *)0x6:
        goto switchD_002f0fa5_caseD_6;
      case (helics *)0x8:
        goto switchD_002f0fa5_caseD_8;
      case (helics *)0x9:
        goto switchD_002f0fa5_caseD_9;
      }
      break;
    case (helics *)0x3:
switchD_002f10a3_caseD_3:
      iVar13 = bcmp(pcVar23,"monitor",__n);
      if (iVar13 != 0) {
        switch(phVar1) {
        case (helics *)0x0:
          goto switchD_002f0fa5_caseD_0;
        case (helics *)0x1:
          goto switchD_002f0fa5_caseD_1;
        default:
          goto switchD_002f0fa5_caseD_4;
        case (helics *)0x3:
          goto switchD_002f1143_caseD_7;
        case (helics *)0x5:
          goto switchD_002f0fa5_caseD_5;
        case (helics *)0x6:
          goto switchD_002f0fa5_caseD_6;
        case (helics *)0x8:
          goto switchD_002f0fa5_caseD_8;
        case (helics *)0x9:
          goto switchD_002f0fa5_caseD_9;
        }
      }
      local_2a8._0_8_ = (CoreBroker *)local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"\"","");
      pbVar19 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2a8,(this->mTimeMonitorFederate)._M_dataplus._M_p,
                            (this->mTimeMonitorFederate)._M_string_length);
      local_288._0_8_ = (pbVar19->_M_dataplus)._M_p;
      paVar20 = &pbVar19->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._0_8_ == paVar20) {
        local_288._16_8_ = paVar20->_M_allocated_capacity;
        local_288._24_8_ = *(size_type *)((long)&pbVar19->field_2 + 8);
        local_288._0_8_ = (CoreBroker *)(local_288 + 0x10);
      }
      else {
        local_288._16_8_ = paVar20->_M_allocated_capacity;
      }
      local_288._8_8_ = pbVar19->_M_string_length;
      (pbVar19->_M_dataplus)._M_p = (pointer)paVar20;
      pbVar19->_M_string_length = 0;
      (pbVar19->field_2)._M_local_buf[0] = '\0';
      pbVar19 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_288,local_288._8_8_,0,1,'\"');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = (pbVar19->_M_dataplus)._M_p;
      paVar20 = &pbVar19->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 == paVar20) {
        uVar10 = *(undefined8 *)((long)&pbVar19->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar20->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar9;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar20->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar19->_M_string_length;
      (pbVar19->_M_dataplus)._M_p = (pointer)paVar20;
      pbVar19->_M_string_length = 0;
      (pbVar19->field_2)._M_local_buf[0] = '\0';
      if ((CoreBroker *)local_288._0_8_ != (CoreBroker *)(local_288 + 0x10)) {
        operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
      }
      pp_Var25 = (_func_int **)local_298._0_8_;
      pCVar26 = (CoreBroker *)local_2a8._0_8_;
      if ((CoreBroker *)local_2a8._0_8_ == (CoreBroker *)local_298) goto LAB_002f1005;
      goto LAB_002f2604;
    case (helics *)0x5:
      goto switchD_002f0fa5_caseD_5;
    case (helics *)0x6:
      goto switchD_002f0fa5_caseD_6;
    case (helics *)0x8:
      goto switchD_002f0fa5_caseD_8;
    case (helics *)0x9:
      goto switchD_002f0fa5_caseD_9;
    }
    break;
  case (helics *)0x5:
switchD_002f0fa5_caseD_5:
    iVar13 = bcmp(pcVar23,"federates",__n);
    if (iVar13 == 0) {
      generateStringVector<gmlc::containers::DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__1>
                (__return_storage_ptr__,&this->mFederates);
      goto LAB_002f1005;
    }
    switch(__n) {
    case 5:
      goto switchD_002f0fa5_caseD_1;
    case 7:
switchD_002f1143_caseD_7:
      iVar13 = bcmp(pcVar23,"brokers",__n);
      if (iVar13 == 0) {
        generateStringVector<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__2>
                  (__return_storage_ptr__,&this->mBrokers);
        goto LAB_002f1005;
      }
      switch(__n) {
      case 5:
        goto switchD_002f0fa5_caseD_1;
      case 10:
        goto switchD_002f0fa5_caseD_6;
      case 0xc:
        goto switchD_002f0fa5_caseD_8;
      case 0xd:
        goto switchD_002f0fa5_caseD_9;
      }
      break;
    case 10:
      goto switchD_002f0fa5_caseD_6;
    case 0xc:
      goto switchD_002f0fa5_caseD_8;
    case 0xd:
      goto switchD_002f0fa5_caseD_9;
    }
    break;
  case (helics *)0x6:
switchD_002f0fa5_caseD_6:
    iVar13 = bcmp(pcVar23,"subbrokers",__n);
    if (iVar13 == 0) {
      generateStringVector_if<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__3,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__4>
                (__return_storage_ptr__,&this->mBrokers);
      goto LAB_002f1005;
    }
    if ((helics *)__n == (helics *)0xd) goto switchD_002f0fa5_caseD_9;
    if ((helics *)__n == (helics *)0xc) goto switchD_002f0fa5_caseD_8;
    if ((helics *)__n == (helics *)0x5) goto switchD_002f0fa5_caseD_1;
    break;
  case (helics *)0x8:
switchD_002f0fa5_caseD_8:
    iVar13 = bcmp(pcVar23,"current_time",__n);
    if (iVar13 == 0) {
      if ((this->super_BrokerBase).hasTimeDependency == false) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{}","");
      }
      else {
        (*((this->super_BrokerBase).timeCoord._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
          _vptr_BaseTimeCoordinator[0xb])(__return_storage_ptr__);
      }
      goto LAB_002f1005;
    }
    if ((helics *)__n == (helics *)0xd) {
LAB_002f1243:
      iVar13 = bcmp(pcVar23,"global_status",__n);
      if ((iVar13 == 0) &&
         (6 < (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR))) {
        local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
        local_288._8_8_ = (object_t *)0x0;
        BrokerBase::addBaseInformation
                  (&this->super_BrokerBase,(json *)local_288,
                   (bool)((this->super_BrokerBase).field_0x294 ^ 1));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<const_char_(&)[13],_char[13],_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_b0,(char (*) [13])0x3eb64d);
        pvVar18 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_288,"status");
        vVar2 = (pvVar18->m_data).m_type;
        (pvVar18->m_data).m_type = local_b0.m_type;
        jVar8 = (pvVar18->m_data).m_value;
        (pvVar18->m_data).m_value = local_b0.m_value;
        local_b0.m_type = vVar2;
        local_b0.m_value = jVar8;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_b0);
        local_168._0_8_ = 0;
        local_168.m_value = (json_value)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_168,-1);
        pvVar18 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_288,"timestep");
        vVar2 = (pvVar18->m_data).m_type;
        (pvVar18->m_data).m_type = local_168.m_type;
        local_168.m_type = vVar2;
        jVar8 = (pvVar18->m_data).m_value;
        (pvVar18->m_data).m_value.object = (object_t *)local_168.m_value;
        local_168.m_value = jVar8;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_168);
        fileops::generateJsonString((string *)__return_storage_ptr__,(json *)local_288,true);
        goto LAB_002f203a;
      }
    }
    else if (((helics *)__n == (helics *)0xc) &&
            (iVar13 = bcmp(pcVar23,"time_monitor",0xc), iVar13 == 0)) {
      iVar13 = (this->mTimeMonitorFederateId).gid;
      if ((iVar13 == -2010000000) || (iVar13 == -1700000000)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{}","");
      }
      else {
        lVar7 = (this->mTimeMonitorCurrentTime).internalTimeCode;
        local_288._0_8_ = (double)(lVar7 % 1000000000) * 1e-09 + (double)(lVar7 / 1000000000);
        local_288._16_8_ = (this->mTimeMonitorFederate)._M_dataplus._M_p;
        local_288._24_8_ = (this->mTimeMonitorFederate)._M_string_length;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)local_288;
        fmt.size_ = 0xda;
        fmt.data_ = (char *)0x1c;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)__return_storage_ptr__,(v11 *)"{{\"time\":{}, \"federate\":{}}}",fmt,
                   args);
      }
      goto LAB_002f1005;
    }
    break;
  case (helics *)0x9:
switchD_002f0fa5_caseD_9:
    iVar13 = bcmp(pcVar23,"current_state",__n);
    if (iVar13 == 0) {
      local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
      local_288._8_8_ = (object_t *)0x0;
      BrokerBase::addBaseInformation
                (&this->super_BrokerBase,(json *)local_288,
                 (bool)((this->super_BrokerBase).field_0x294 ^ 1));
      psVar15 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_70,psVar15);
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"state");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = local_70.m_type;
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value = local_70.m_value;
      local_70.m_type = vVar2;
      local_70.m_value = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_70);
      local_158._0_8_ = 0;
      local_158.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_158,
                 (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7);
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"status");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = local_158.m_type;
      local_158.m_type = vVar2;
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value.object = (object_t *)local_158.m_value;
      local_158.m_value = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_158);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_80,(initializer_list_t)ZEXT816(0),false,array);
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"federates");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = local_80.m_type;
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value = local_80.m_value;
      local_80.m_type = vVar2;
      local_80.m_value = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_80);
      pBVar17 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pBVar4 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_250.internalTimeCode = (baseType)this;
      if (pBVar17 != pBVar4) {
        do {
          local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
          local_2a8._8_8_ = (CoreBroker *)0x0;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)local_1a8,(initializer_list_t)ZEXT816(0),false,object);
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_2a8,"attributes");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_1a8[0];
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value = (json_value)local_1a8._8_8_;
          local_1a8[0] = vVar2;
          local_1a8._8_8_ = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_1a8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1b8,&pBVar17->name);
          pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2a8,"attributes");
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar16,"name");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_1b8._M_local_buf[0];
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value = (json_value)local_1b8._8_8_;
          local_1b8._M_local_buf[0] = vVar2;
          local_1b8._8_8_ = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1b8);
          psVar15 = stateString_abi_cxx11_(pBVar17->state);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1c8,psVar15);
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_2a8,"state");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_1c8.m_type;
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value = local_1c8.m_value;
          local_1c8.m_type = vVar2;
          local_1c8.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_1c8);
          local_208._M_p = (pointer)0x0;
          jStack_200.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_208,(long)(pBVar17->global_id).gid);
          pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2a8,"attributes");
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar16,anon_var_dwarf_70a93 + 0x27);
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = (value_t)local_208._M_p;
          local_208._M_p._0_1_ = vVar2;
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value.object = (object_t *)jStack_200;
          jStack_200 = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_208);
          local_218._M_allocated_capacity = 0;
          local_218._8_8_ = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_218,(long)(pBVar17->parent).gid);
          pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2a8,"attributes");
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar16,"parent");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_218._M_local_buf[0];
          local_218._M_local_buf[0] = vVar2;
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value.object = (object_t *)local_218._8_8_;
          local_218._8_8_ = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_218);
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_288,"federates");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar18,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)local_2a8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_2a8);
          pBVar17 = pBVar17 + 1;
        } while (pBVar17 != pBVar4);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_90,(initializer_list_t)ZEXT816(0),false,array);
      TVar11.internalTimeCode = local_250.internalTimeCode;
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"cores");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = local_90.m_type;
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value = local_90.m_value;
      local_90.m_type = vVar2;
      local_90.m_value = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_90);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_a0,(initializer_list_t)ZEXT816(0),false,array);
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_288,"brokers");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = local_a0.m_type;
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value = local_a0.m_value;
      local_a0.m_type = vVar2;
      local_a0.m_value = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a0);
      val_00 = (((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                  *)(TVar11.internalTimeCode + 0x360))->dataStorage).
               super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar5 = *(pointer *)(TVar11.internalTimeCode + 0x368);
      if (val_00 != pBVar5) {
        do {
          local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
          local_2a8._8_8_ = (CoreBroker *)0x0;
          psVar15 = stateString_abi_cxx11_(val_00->state);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1d8,psVar15);
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_2a8,"state");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_1d8._M_local_buf[0];
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value = (json_value)local_1d8._8_8_;
          local_1d8._M_local_buf[0] = vVar2;
          local_1d8._8_8_ = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1d8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1e8,(initializer_list_t)ZEXT816(0),false,object);
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_2a8,"attributes");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_1e8.m_type;
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value = local_1e8.m_value;
          local_1e8.m_type = vVar2;
          local_1e8.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_1e8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1f8,&val_00->name);
          pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2a8,"attributes");
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar16,"name");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = local_1f8._M_local_buf[0];
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value = (json_value)local_1f8._8_8_;
          local_1f8._M_local_buf[0] = vVar2;
          local_1f8._8_8_ = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1f8);
          local_228._M_p = (pointer)0x0;
          jStack_220.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_228,(long)(val_00->global_id).gid);
          pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2a8,"attributes");
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar16,anon_var_dwarf_70a93 + 0x27);
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = (value_t)local_228._M_p;
          local_228._M_p._0_1_ = vVar2;
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value.object = (object_t *)jStack_220;
          jStack_220 = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_228);
          local_238.internalTimeCode = 0;
          jStack_230.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_238,(long)(val_00->parent).gid);
          pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2a8,"attributes");
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar16,"parent");
          vVar2 = (pvVar18->m_data).m_type;
          (pvVar18->m_data).m_type = (value_t)local_238.internalTimeCode;
          local_238.internalTimeCode._0_1_ = vVar2;
          jVar8 = (pvVar18->m_data).m_value;
          (pvVar18->m_data).m_value.object = (object_t *)jStack_230;
          jStack_230 = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_238);
          pcVar23 = "brokers";
          if (val_00->_core != false) {
            pcVar23 = "cores";
          }
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_288,pcVar23);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar18,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)local_2a8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_2a8);
          val_00 = val_00 + 1;
        } while (val_00 != pBVar5);
      }
      fileops::generateJsonString((string *)__return_storage_ptr__,(json *)local_288,true);
LAB_002f203a:
      this_00 = (data *)local_288;
LAB_002f203f:
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(this_00);
      goto LAB_002f1005;
    }
    if ((helics *)__n == (helics *)0xd) goto LAB_002f1243;
    if ((helics *)__n == (helics *)0xc) goto switchD_002f0fa5_caseD_8;
  }
switchD_002f0fa5_caseD_4:
  iVar13 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                     (&local_260,0,7,"rename:");
  if (iVar13 == 0) {
    if (local_260._M_len < (helics *)0x7) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",7,
                 local_260._M_len);
    }
    name._M_str = (char *)((long)local_260._M_str + 7);
    name._M_len = (size_t)(local_260._M_len - 7);
    generateRename_abi_cxx11_(__return_storage_ptr__,this,name);
    goto LAB_002f1005;
  }
  cVar14 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                   *)mapIndex,(key_type *)&local_260);
  if (cVar14._M_node != (_Base_ptr)(mapIndex + 8)) {
    index = *(ushort *)&cVar14._M_node[1]._M_left;
    uVar22 = (uint)index;
    ptVar3 = (this->mapBuilders).
             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((uint)index <
         (((uint)(*(int *)&(this->mapBuilders).
                           super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (int)ptVar3) >> 5) *
          -0x55555555 & 0xffff)) && (*(char *)((long)&cVar14._M_node[1]._M_left + 2) == '\0')) {
      pJVar21 = (JsonMapBuilder *)
                ((long)&(ptVar3->
                        super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                        ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl
                        .jMap._M_t.
                        super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        .
                        super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                        ._M_head_impl + (ulong)(uVar22 * 0x60));
      bVar12 = fileops::JsonMapBuilder::isCompleted(pJVar21);
      if (bVar12) {
        local_250.internalTimeCode = (baseType)this;
        iVar13 = generateMapObjectCounter(this);
        if (iVar13 == *(int *)((long)&(ptVar3->
                                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                      ).
                                      super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                                      _M_head_impl.counterCode + (ulong)(uVar22 * 0x60))) {
          fileops::JsonMapBuilder::generate_abi_cxx11_((string *)__return_storage_ptr__,pJVar21);
          goto LAB_002f1005;
        }
        fileops::JsonMapBuilder::reset(pJVar21);
        this = (CoreBroker *)local_250.internalTimeCode;
      }
      if ((pJVar21->jMap)._M_t.
          super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
          .
          super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
          ._M_head_impl !=
          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"#wait","")
        ;
        goto LAB_002f1005;
      }
    }
    request_00._M_str = local_260._M_str;
    request_00._M_len = local_260._M_len;
    initializeMapBuilder
              (this,request_00,index,*(QueryReuse *)((long)&cVar14._M_node[1]._M_left + 2),
               force_ordering);
    bVar12 = fileops::JsonMapBuilder::isCompleted
                       ((JsonMapBuilder *)
                        ((long)&(((this->mapBuilders).
                                  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                                _M_head_impl.jMap._M_t.
                                super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                .
                                super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                                ._M_head_impl + (ulong)(uVar22 * 0x60)));
    if (bVar12) {
      if (*(char *)((long)&cVar14._M_node[1]._M_left + 2) == '\0') {
        iVar13 = generateMapObjectCounter(this);
        *(int *)((long)&(((this->mapBuilders).
                          super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                        ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl
                        .counterCode + (ulong)(uVar22 * 0x60)) = iVar13;
      }
      pJVar21 = (JsonMapBuilder *)
                ((long)&(((this->mapBuilders).
                          super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                        ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl
                        .jMap._M_t.
                        super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        .
                        super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                        ._M_head_impl + (ulong)(uVar22 * 0x60));
      if (index == 9) {
        generateGlobalStatus_abi_cxx11_(__return_storage_ptr__,this,pJVar21);
      }
      else {
        fileops::JsonMapBuilder::generate_abi_cxx11_((string *)__return_storage_ptr__,pJVar21);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"#wait","");
    }
    goto LAB_002f1005;
  }
  local_2a8._8_8_ = (CoreBroker *)0x0;
  local_298._8_8_ =
       CLI::std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:3720:22)>
       ::_M_invoke;
  local_298._0_8_ =
       CLI::std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:3720:22)>
       ::_M_manager;
  request_01._M_str = (char *)&this->handles;
  request_01._M_len = (size_t)local_260._M_str;
  local_2a8._0_8_ = this;
  generateInterfaceQueryResults
            ((string *)local_288,(helics *)local_260._M_len,request_01,(HandleManager *)0x8831d580,
             (GlobalFederateId)(BaseType)local_2a8,in_stack_fffffffffffffd48);
  if ((_func_int **)local_298._0_8_ != (_func_int **)0x0) {
    (*(code *)local_298._0_8_)(local_2a8,local_2a8,3);
  }
  if ((object_t *)local_288._8_8_ == (object_t *)0x0) {
    if ((helics *)local_260._M_len == (helics *)0xc) {
      iVar13 = bcmp(local_260._M_str,"dependencies",0xc);
      if (iVar13 != 0) goto LAB_002f1e93;
      local_248.m_type = null;
      local_248.m_value.object = (object_t *)0x0;
      BrokerBase::addBaseInformation
                (&this->super_BrokerBase,(json *)&local_248,
                 (bool)((this->super_BrokerBase).field_0x294 ^ 1));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_c0,(initializer_list_t)ZEXT816(0),false,array);
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_248,"dependents");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = local_c0.m_type;
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value = local_c0.m_value;
      local_c0.m_type = vVar2;
      local_c0.m_value = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_c0);
      local_250.internalTimeCode = (baseType)this;
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 local_2a8,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      uVar10 = local_2a8._8_8_;
      if (local_2a8._0_8_ != local_2a8._8_8_) {
        pCVar26 = (CoreBroker *)local_2a8._0_8_;
        do {
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_248,"dependents");
          local_198._0_8_ = 0;
          local_198.m_value = (json_value)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_198,(long)*(int *)&(pCVar26->super_Broker)._vptr_Broker);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar18,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_198);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_198);
          pCVar26 = (CoreBroker *)((long)&(pCVar26->super_Broker)._vptr_Broker + 4);
        } while (pCVar26 != (CoreBroker *)uVar10);
      }
      if ((CoreBroker *)local_2a8._0_8_ != (CoreBroker *)0x0) {
        operator_delete((void *)local_2a8._0_8_,local_298._0_8_ - local_2a8._0_8_);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_d0,(initializer_list_t)ZEXT816(0),false,array);
      TVar11.internalTimeCode = local_250.internalTimeCode;
      pvVar18 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_248,"dependencies");
      vVar2 = (pvVar18->m_data).m_type;
      (pvVar18->m_data).m_type = local_d0.m_type;
      jVar8 = (pvVar18->m_data).m_value;
      (pvVar18->m_data).m_value = local_d0.m_value;
      local_d0.m_type = vVar2;
      local_d0.m_value = jVar8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_d0);
      BaseTimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 local_2a8,
                 (((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                    *)(TVar11.internalTimeCode + 0xf0))->_M_t).
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      uVar10 = local_2a8._8_8_;
      if (local_2a8._0_8_ != local_2a8._8_8_) {
        pCVar26 = (CoreBroker *)local_2a8._0_8_;
        do {
          pvVar18 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_248,"dependencies");
          local_198._0_8_ = 0;
          local_198.m_value = (json_value)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_198,(long)*(int *)&(pCVar26->super_Broker)._vptr_Broker);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar18,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_198);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_198);
          pCVar26 = (CoreBroker *)((long)&(pCVar26->super_Broker)._vptr_Broker + 4);
        } while (pCVar26 != (CoreBroker *)uVar10);
      }
      if ((CoreBroker *)local_2a8._0_8_ != (CoreBroker *)0x0) {
        operator_delete((void *)local_2a8._0_8_,local_298._0_8_ - local_2a8._0_8_);
      }
      fileops::generateJsonString((string *)__return_storage_ptr__,(json *)&local_248,true);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_248);
    }
    else {
      if ((helics *)local_260._M_len == (helics *)0xa) {
        iVar13 = bcmp(local_260._M_str,"dependents",10);
        if (iVar13 != 0) goto LAB_002f1e93;
        BaseTimeCoordinator::getDependents
                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                   local_2a8,
                   (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
        generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__8>
                  (__return_storage_ptr__,local_2a8);
LAB_002f25d6:
        if ((CoreBroker *)local_2a8._0_8_ == (CoreBroker *)0x0) goto LAB_002f25ed;
        pcVar24 = (code *)(local_298._0_8_ - local_2a8._0_8_);
      }
      else {
        if (((helics *)local_260._M_len == (helics *)0x9) &&
           (iVar13 = bcmp(local_260._M_str,"dependson",9), iVar13 == 0)) {
          BaseTimeCoordinator::getDependencies
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     local_2a8,
                     (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__7>
                    (__return_storage_ptr__,local_2a8);
          goto LAB_002f25d6;
        }
LAB_002f1e93:
        local_2a8._0_8_ = (CoreBroker *)local_298;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"unrecognized broker query","");
        generateJsonErrorResponse((string *)__return_storage_ptr__,BAD_REQUEST,(string *)local_2a8);
        if ((CoreBroker *)local_2a8._0_8_ == (CoreBroker *)local_298) goto LAB_002f25ed;
        pcVar24 = (code *)(local_298._0_8_ + 1);
      }
      operator_delete((void *)local_2a8._0_8_,(ulong)pcVar24);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((CoreBroker *)local_288._0_8_ == (CoreBroker *)(local_288 + 0x10)) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_288._16_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_288._24_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_288._0_8_;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_288._16_8_;
    }
    __return_storage_ptr__->_M_string_length = local_288._8_8_;
    local_288._8_8_ = (object_t *)0x0;
    local_288._16_8_ = local_288._16_8_ & 0xffffffffffffff00;
    local_288._0_8_ = (CoreBroker *)(local_288 + 0x10);
  }
LAB_002f25ed:
  pp_Var25 = (_func_int **)local_288._16_8_;
  pCVar26 = (CoreBroker *)local_288._0_8_;
  if ((CoreBroker *)local_288._0_8_ != (CoreBroker *)(local_288 + 0x10)) {
LAB_002f2604:
    operator_delete(pCVar26,(ulong)((long)pp_Var25 + 1));
  }
LAB_002f1005:
  if ((__pthread_internal_list *)local_188._0_8_ != (__pthread_internal_list *)(local_188 + 0x10)) {
    operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::generateQueryAnswer(std::string_view request, bool force_ordering)
{
    auto addHeader = [this](nlohmann::json& base) { addBaseInformation(base, !isRootc); };

    auto res = quickBrokerQueries(request);
    if (!res.empty()) {
        return res;
    }
    if (request == "counts") {
        nlohmann::json base;
        addHeader(base);
        base["brokers"] = static_cast<int>(mBrokers.size());
        base["federates"] = static_cast<int>(mFederates.size());
        base["countable_federates"] = getCountableFederates();
        base["interfaces"] = static_cast<int>(handles.size());
        return fileops::generateJsonString(base);
    }
    if (request == "summary") {
        return generateFederationSummary();
    }
    if (request == "config") {
        nlohmann::json base;
        base["name"] = getIdentifier();
        if (uuid_like) {
            base["uuid"] = getIdentifier();
        }
        if (!isRootc) {
            base["parent"] = higher_broker_id.baseValue();
        }
        base["id"] = global_broker_id_local.baseValue();
        base["log_level"] = logLevelToString(static_cast<LogLevels>(maxLogLevel.load()));
        base["root"] = isRoot();
        return fileops::generateJsonString(base);
    }
    if (request == "monitor") {
        return std::string{"\""} + mTimeMonitorFederate + '"';
    }
    if (request == "logs") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (request == "federates") {
        return generateStringVector(mFederates, [](auto& fed) { return fed.name; });
    }
    if (request == "brokers") {
        return generateStringVector(mBrokers, [](auto& brk) { return brk.name; });
    }
    if (request == "subbrokers") {
        return generateStringVector_if(
            mBrokers, [](auto& brk) { return brk.name; }, [](auto& brk) { return !brk._core; });
    }
    if (request == "cores") {
        return generateStringVector_if(
            mBrokers, [](auto& brk) { return brk.name; }, [](auto& brk) { return brk._core; });
    }
    if (request == "current_state") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["state"] = brokerStateName(getBrokerState());
        base["status"] = isConnected();
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : mFederates) {
            nlohmann::json fedstate;
            fedstate["attributes"] = nlohmann::json::object();
            fedstate["attributes"]["name"] = fed.name;
            fedstate["state"] = stateString(fed.state);
            fedstate["attributes"]["id"] = fed.global_id.baseValue();
            fedstate["attributes"]["parent"] = fed.parent.baseValue();
            base["federates"].push_back(std::move(fedstate));
        }
        base["cores"] = nlohmann::json::array();
        base["brokers"] = nlohmann::json::array();
        for (const auto& brk : mBrokers) {
            nlohmann::json brkstate;
            brkstate["state"] = stateString(brk.state);
            brkstate["attributes"] = nlohmann::json::object();
            brkstate["attributes"]["name"] = brk.name;
            brkstate["attributes"]["id"] = brk.global_id.baseValue();
            brkstate["attributes"]["parent"] = brk.parent.baseValue();
            if (brk._core) {
                base["cores"].push_back(std::move(brkstate));
            } else {
                base["brokers"].push_back(std::move(brkstate));
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "current_time") {
        if (!hasTimeDependency) {
            return "{}";
        }
        return timeCoord->printTimeStatus();
    }
    if (request == "time_monitor") {
        if (mTimeMonitorFederateId.isValid()) {
            return fmt::format(R"raw({{"time":{}, "federate":{}}})raw",
                               static_cast<double>(mTimeMonitorCurrentTime),
                               mTimeMonitorFederate);
        }
        return "{}";
    }
    if (request == "global_status") {
        if (!isConnected()) {
            nlohmann::json json;
            addBaseInformation(json, !isRootc);
            json["status"] = "disconnected";
            json["timestep"] = -1;
            return fileops::generateJsonString(json);
        }
    }
    if (request.compare(0, 7, "rename:") == 0) {
        return generateRename(request.substr(7));
    }
    auto mapping = mapIndex.find(request);
    if (mapping != mapIndex.end()) {
        auto index = mapping->second.first;
        if (isValidIndex(index, mapBuilders) && mapping->second.second == QueryReuse::ENABLED) {
            auto& builder = std::get<0>(mapBuilders[index]);
            if (builder.isCompleted()) {
                auto center = generateMapObjectCounter();
                if (center == builder.getCounterCode()) {
                    return builder.generate();
                }
                builder.reset();
            }
            if (builder.isActive()) {
                return "#wait";
            }
        }

        initializeMapBuilder(request, index, mapping->second.second, force_ordering);
        if (std::get<0>(mapBuilders[index]).isCompleted()) {
            if (mapping->second.second == QueryReuse::ENABLED) {
                auto center = generateMapObjectCounter();
                std::get<0>(mapBuilders[index]).setCounterCode(center);
            }
            if (index == GLOBAL_STATUS) {
                return generateGlobalStatus(std::get<0>(mapBuilders[index]));
            }
            return std::get<0>(mapBuilders[index]).generate();
        }
        return "#wait";
    }
    auto interfaceQueryResult =
        generateInterfaceQueryResults(request, handles, GlobalFederateId{}, addHeader);
    if (!interfaceQueryResult.empty()) {
        return interfaceQueryResult;
    }
    if (request == "dependson") {
        return generateStringVector(timeCoord->getDependencies(), [](const auto& dep) {
            return std::to_string(dep.baseValue());
        });
    }
    if (request == "dependents") {
        return generateStringVector(timeCoord->getDependents(), [](const auto& dep) {
            return std::to_string(dep.baseValue());
        });
    }
    if (request == "dependencies") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["dependents"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized broker query");
}